

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_number.cpp
# Opt level: O0

void __thiscall
JsonNumber_IntegerMax_Test::~JsonNumber_IntegerMax_Test(JsonNumber_IntegerMax_Test *this)

{
  JsonNumber_IntegerMax_Test *this_local;
  
  ~JsonNumber_IntegerMax_Test(this);
  operator_delete(this,0x338);
  return;
}

Assistant:

TEST_F (JsonNumber, IntegerMax) {
    constexpr auto long_max = std::numeric_limits<std::int64_t>::max ();
    auto const str_max = std::to_string (long_max);

    EXPECT_CALL (callbacks_, uint64_value (long_max)).Times (1);
    json::parser<decltype (proxy_)> p (proxy_);
    p.input (str_max).eof ();
    EXPECT_FALSE (p.has_error ());
}